

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pembase64.c
# Opt level: O0

int ptls_compare_separator_line(char *line,char *begin_or_end,char *label)

{
  size_t sVar1;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  size_t label_length;
  size_t begin_or_end_length;
  size_t text_index;
  int ret;
  long local_28;
  int local_1c;
  
  local_1c = strncmp(in_RDI,"-----",5);
  local_28 = 5;
  if (local_1c == 0) {
    sVar1 = strlen(in_RSI);
    local_1c = strncmp(in_RDI + 5,in_RSI,sVar1);
    local_28 = sVar1 + 5;
  }
  if (local_1c == 0) {
    local_1c = in_RDI[local_28] + -0x20;
    local_28 = local_28 + 1;
  }
  if (local_1c == 0) {
    sVar1 = strlen(in_RDX);
    local_1c = strncmp(in_RDI + local_28,in_RDX,sVar1);
    local_28 = sVar1 + local_28;
  }
  if (local_1c == 0) {
    local_1c = strncmp(in_RDI + local_28,"-----",5);
  }
  return local_1c;
}

Assistant:

static int ptls_compare_separator_line(const char *line, const char *begin_or_end, const char *label)
{
    int ret = strncmp(line, "-----", 5);
    size_t text_index = 5;

    if (ret == 0) {
        size_t begin_or_end_length = strlen(begin_or_end);
        ret = strncmp(line + text_index, begin_or_end, begin_or_end_length);
        text_index += begin_or_end_length;
    }

    if (ret == 0) {
        ret = line[text_index] - ' ';
        text_index++;
    }

    if (ret == 0) {
        size_t label_length = strlen(label);
        ret = strncmp(line + text_index, label, label_length);
        text_index += label_length;
    }

    if (ret == 0) {
        ret = strncmp(line + text_index, "-----", 5);
    }

    return ret;
}